

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O2

Type __thiscall wasm::WasmBinaryReader::getConcreteType(WasmBinaryReader *this)

{
  Type TVar1;
  string local_40;
  allocator<char> local_19;
  
  TVar1 = getType(this);
  if (1 < TVar1.id) {
    return (Type)TVar1.id;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"non-concrete type when one expected",&local_19);
  throwError(this,&local_40);
}

Assistant:

Type WasmBinaryReader::getConcreteType() {
  auto type = getType();
  if (!type.isConcrete()) {
    throwError("non-concrete type when one expected");
  }
  return type;
}